

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * __thiscall
util::format<char_const*,std::__cxx11::string_const&,char_const(&)[2]>
          (string *__return_storage_ptr__,util *this,char *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,char (*args_1) [2]
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  allocator<char> local_a1;
  string local_a0 [32];
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [32];
  
  args_00 = args;
  std::__cxx11::string::string<std::allocator<char>>(local_40,(char *)this,&local_a1);
  std::__cxx11::string::string((string *)&local_60,local_40);
  std::__cxx11::string::string(local_a0,(string *)arg);
  format<std::__cxx11::string,char_const(&)[2]>
            (&local_80,(util *)local_a0,args,(char (*) [2])args_00);
  std::operator+(__return_storage_ptr__,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string format(T arg, Args&&... args)
{
    using namespace std; // pull in to_string for other types
    std::string s = to_string(arg) + format(std::forward<Args>(args)...);
    return s;
}